

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_raw_set_fixed_value(parser_info *info)

{
  int iVar1;
  long length;
  long value_length;
  parser_info *info_local;
  
  iVar1 = decode_escaped_string(info->node->char_data);
  length = (long)iVar1;
  if (length < 0) {
    coda_set_error(-400,"invalid escape sequence in string");
    info_local._4_4_ = -1;
  }
  else if ((length < 1) ||
          (iVar1 = coda_type_raw_set_fixed_value
                             ((coda_type_raw *)info->node->parent->data,length,info->node->char_data
                             ), iVar1 == 0)) {
    info_local._4_4_ = 0;
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_raw_set_fixed_value(parser_info *info)
{
    long value_length;

    value_length = decode_escaped_string(info->node->char_data);
    if (value_length < 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid escape sequence in string");
        return -1;
    }
    if (value_length > 0)
    {
        if (coda_type_raw_set_fixed_value((coda_type_raw *)info->node->parent->data, value_length,
                                          info->node->char_data) != 0)
        {
            return -1;
        }
    }

    return 0;
}